

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void JitFFI::SysV64::create_return_copy(JitFuncCallerCreater *jfcc,uint size)

{
  uint size_local;
  JitFuncCallerCreater *jfcc_local;
  
  OpCode_x64::mov((jfcc->super_JitFuncCallerCreaterX64).data,rsi,rsp);
  OpCode_x64::mov((jfcc->super_JitFuncCallerCreaterX64).data,rdi,rbx);
  OpCode_x64::movd_u32((jfcc->super_JitFuncCallerCreaterX64).data,ecx,size);
  OpCode_x64::movsb_prdi_prsi_rep((jfcc->super_JitFuncCallerCreaterX64).data);
  return;
}

Assistant:

static void create_return_copy(JitFuncCallerCreater &jfcc, unsigned int size) {
			mov(jfcc.data, rsi, rsp);
			mov(jfcc.data, rdi, rbx);
			movd_u32(jfcc.data, ecx, size);
			movsb_prdi_prsi_rep(jfcc.data);
		}